

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerReflection::compile_abi_cxx11_
          (string *__return_storage_ptr__,CompilerReflection *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Stream *pSVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_29;
  Stream *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  local_28 = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<simple_json::Stream,std::allocator<simple_json::Stream>>
            (&_Stack_20,&local_28,(allocator<simple_json::Stream> *)&local_29);
  _Var2._M_pi = _Stack_20._M_pi;
  pSVar1 = local_28;
  local_28 = (Stream *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pSVar1;
  (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
    }
  }
  pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pSVar1->current_locale_radix_character = (this->super_CompilerGLSL).current_locale_radix_character
  ;
  simple_json::Stream::begin_json_object(pSVar1);
  CompilerGLSL::reorder_type_alias(&this->super_CompilerGLSL);
  emit_entry_points(this);
  emit_types(this);
  emit_resources(this);
  emit_specialization_constants(this);
  simple_json::Stream::end_json_object
            ((this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,
             &((this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->buffer);
  return __return_storage_ptr__;
}

Assistant:

string CompilerReflection::compile()
{
	json_stream = std::make_shared<simple_json::Stream>();
	json_stream->set_current_locale_radix_character(current_locale_radix_character);
	json_stream->begin_json_object();
	reorder_type_alias();
	emit_entry_points();
	emit_types();
	emit_resources();
	emit_specialization_constants();
	json_stream->end_json_object();
	return json_stream->str();
}